

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

ostream * __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::report_signature
          (call_matcher<void_(),_std::tuple<>_> *this,ostream *os)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  char local_19;
  
  pcVar1 = (this->super_call_matcher_base<void_()>).name;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," at ",4);
  if ((this->super_call_matcher_base<void_()>).loc.line != 0) {
    pcVar1 = (this->super_call_matcher_base<void_()>).loc.file;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar2);
    }
    local_19 = ':';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  return os;
}

Assistant:

std::ostream&
    report_signature(
      std::ostream& os)
    const override
    {
      return os << name << " at " << loc;
    }